

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>
::Boundary_matrix(Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>
                  *this,Column_settings *colSettings)

{
  Matrix_all_dimension_holder<int>::Matrix_all_dimension_holder
            (&this->super_Matrix_dimension_option,-1);
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>
  ::Base_swap(&this->
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
             );
  (this->matrix_)._M_h._M_buckets = &(this->matrix_)._M_h._M_single_bucket;
  (this->matrix_)._M_h._M_bucket_count = 1;
  (this->matrix_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->matrix_)._M_h._M_element_count = 0;
  (this->matrix_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->matrix_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->matrix_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->nextInsertIndex_ = 0;
  this->colSettings_ = colSettings;
  return;
}

Assistant:

inline Boundary_matrix<Master_matrix>::Boundary_matrix(Column_settings* colSettings)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Swap_opt(),
      Pair_opt(),
      RA_opt(),
      nextInsertIndex_(0),
      colSettings_(colSettings)
{}